

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_str_a_characters_bp(archive_write *a,uchar *bp,int from,int to,char *s,vdc vdc)

{
  int local_30;
  int r;
  vdc vdc_local;
  char *s_local;
  int to_local;
  int from_local;
  uchar *bp_local;
  archive_write *a_local;
  
  if (vdc == VDC_STD) {
    set_str(bp + from,s,(long)((to - from) + 1),' ',"");
    local_30 = 0;
  }
  else if (vdc == VDC_LOWERCASE) {
    set_str(bp + from,s,(long)((to - from) + 1),' ',"");
    local_30 = 0;
  }
  else if (vdc - VDC_UCS2 < 2) {
    local_30 = set_str_utf16be(a,bp + from,s,(long)((to - from) + 1),0x20,vdc);
  }
  else {
    local_30 = -0x1e;
  }
  return local_30;
}

Assistant:

static int
set_str_a_characters_bp(struct archive_write *a, unsigned char *bp,
    int from, int to, const char *s, enum vdc vdc)
{
	int r;

	switch (vdc) {
	case VDC_STD:
		set_str(bp+from, s, to - from + 1, 0x20,
		    a_characters_map);
		r = ARCHIVE_OK;
		break;
	case VDC_LOWERCASE:
		set_str(bp+from, s, to - from + 1, 0x20,
		    a1_characters_map);
		r = ARCHIVE_OK;
		break;
	case VDC_UCS2:
	case VDC_UCS2_DIRECT:
		r = set_str_utf16be(a, bp+from, s, to - from + 1,
		    0x0020, vdc);
		break;
	default:
		r = ARCHIVE_FATAL;
	}
	return (r);
}